

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderUtil.cpp
# Opt level: O3

DataType glu::getDataTypeVector(DataType scalarType,int size)

{
  DataType DVar1;
  
  DVar1 = TYPE_INVALID;
  if ((scalarType < TYPE_BOOL_VEC2) &&
     (DVar1 = TYPE_INVALID, (0x888004002U >> ((ulong)scalarType & 0x3f) & 1) != 0)) {
    DVar1 = (scalarType + size) - TYPE_FLOAT;
  }
  return DVar1;
}

Assistant:

DataType getDataTypeVector (DataType scalarType, int size)
{
	DE_ASSERT(deInRange32(size, 1, 4));
	switch (scalarType)
	{
		case TYPE_FLOAT:
		case TYPE_DOUBLE:
		case TYPE_INT:
		case TYPE_UINT:
		case TYPE_BOOL:
			return (DataType)((int)scalarType + size - 1);
		default:
			return TYPE_INVALID;
	}
}